

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::iterate(ShaderAtomicOpCase *this)

{
  glBindBufferFunc p_Var1;
  glBufferDataFunc p_Var2;
  glBindBufferBaseFunc p_Var3;
  glDispatchComputeFunc p_Var4;
  int iVar5;
  GLuint index;
  uint uVar6;
  uint uVar7;
  deBool dVar8;
  deUint32 dVar9;
  GLenum GVar10;
  uint uVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  TestError *pTVar13;
  ulong uVar14;
  reference pvVar15;
  void *pvVar16;
  char *description;
  bool isOk;
  void *resPtr;
  deUint32 valNdx;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  allocator<unsigned_char> local_1c9;
  undefined1 local_1c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  undefined1 local_1a8 [4];
  deUint32 numValues;
  InterfaceVariableInfo groupVarInfo;
  undefined1 local_150 [4];
  deUint32 groupVarNdx;
  InterfaceVariableInfo outVarInfo;
  undefined1 local_f8 [4];
  deUint32 outVarNdx;
  InterfaceVariableInfo inVarInfo;
  undefined1 local_a0 [4];
  deUint32 inVarNdx;
  InterfaceBlockInfo blockInfo;
  undefined1 local_40 [4];
  deUint32 blockNdx;
  Buffer inoutBuffer;
  deUint32 program;
  Functions *gl;
  ShaderAtomicOpCase *this_local;
  Functions *gl_00;
  
  pRVar12 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar12->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  inoutBuffer.super_ObjectWrapper._20_4_ = glu::ShaderProgram::getProgram(this->m_program);
  pRVar12 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_40,pRVar12);
  index = (*gl_00->getProgramResourceIndex)(inoutBuffer.super_ObjectWrapper._20_4_,0x92e6,"InOut");
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)local_a0,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e6,
             index);
  inVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.inputValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_f8,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             inVarInfo._76_4_);
  outVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.outputValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_150,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             outVarInfo._76_4_);
  groupVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.groupValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_1a8,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             groupVarInfo._76_4_);
  uVar6 = product<unsigned_int,3>(&this->m_workGroupSize);
  uVar7 = product<unsigned_int,3>(&this->m_numWorkGroups);
  bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uVar6 * uVar7;
  while ((((dVar8 = ::deGetFalse(), dVar9 = groupVarInfo.atomicCounterBufferIndex, dVar8 == 0 &&
           (inVarInfo.atomicCounterBufferIndex ==
            bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_)) &&
          (outVarInfo.atomicCounterBufferIndex ==
           bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_)) &&
         (uVar6 = product<unsigned_int,3>(&this->m_numWorkGroups), dVar9 == uVar6))) {
    dVar8 = ::deGetFalse();
    if (dVar8 == 0) {
      (*gl_00->useProgram)(inoutBuffer.super_ObjectWrapper._20_4_);
      uVar14 = (ulong)blockInfo.index;
      std::allocator<unsigned_char>::allocator(&local_1c9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,uVar14,
                 &local_1c9);
      std::allocator<unsigned_char>::~allocator(&local_1c9);
      local_1d8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      _valNdx = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      resPtr._4_4_ = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                (local_1d8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )_valNdx,(int *)((long)&resPtr + 4));
      dVar9 = inVarInfo.arraySize;
      uVar6 = bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)uVar6,(ulong)dVar9,pvVar15 + inVarInfo.type);
      if (this->m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE) {
        for (resPtr._0_4_ = 0; uVar6 = (uint)resPtr,
            uVar7 = product<unsigned_int,3>(&this->m_numWorkGroups), uVar6 < uVar7;
            resPtr._0_4_ = (uint)resPtr + 1) {
          dVar9 = this->m_initialValue;
          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0)
          ;
          *(deUint32 *)
           (pvVar15 + (ulong)(groupVarInfo.arraySize * (uint)resPtr) + (ulong)groupVarInfo.type) =
               dVar9;
        }
      }
      p_Var1 = gl_00->bindBuffer;
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_40);
      (*p_Var1)(0x90d2,dVar9);
      p_Var2 = gl_00->bufferData;
      uVar14 = (ulong)blockInfo.index;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
      (*p_Var2)(0x90d2,uVar14,pvVar15,0x88e5);
      p_Var3 = gl_00->bindBufferBase;
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_40);
      (*p_Var3)(0x90d2,0,dVar9);
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"Output buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0xe3);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      p_Var4 = gl_00->dispatchCompute;
      uVar6 = tcu::Vector<unsigned_int,_3>::x(&this->m_numWorkGroups);
      uVar7 = tcu::Vector<unsigned_int,_3>::y(&this->m_numWorkGroups);
      uVar11 = tcu::Vector<unsigned_int,_3>::z(&this->m_numWorkGroups);
      (*p_Var4)(uVar6,uVar7,uVar11);
      pvVar16 = (*gl_00->mapBufferRange)(0x90d2,0,(ulong)blockInfo.index,1);
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0xed);
      while ((dVar8 = ::deGetFalse(), dVar8 == 0 && (pvVar16 != (void *)0x0))) {
        dVar8 = ::deGetFalse();
        if (dVar8 == 0) {
          uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                            (this,(ulong)bufData.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (ulong)inVarInfo.arraySize,(long)pvVar16 + (ulong)inVarInfo.type,
                             (ulong)outVarInfo.arraySize,(long)pvVar16 + (ulong)outVarInfo.type,
                             groupVarInfo.arraySize,(long)pvVar16 + (ulong)groupVarInfo.type);
          (*gl_00->unmapBuffer)(0x90d2);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"glUnmapBuffer()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                          ,0xf6);
          description = "Comparison failed";
          if ((uVar6 & 1) != 0) {
            description = "Pass";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     (byte)~((byte)uVar6 & 1) & QP_TEST_RESULT_FAIL,description);
          glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_1a8);
          glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_150);
          glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_f8);
          glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_a0);
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)local_40);
          return STOP;
        }
      }
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,(char *)0x0,"resPtr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                 ,0xee);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar13,(char *)0x0,
             "inVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
             ,0xcf);
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicOpCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				inVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.inputValues[0]");
	const InterfaceVariableInfo	inVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, inVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(inVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// Setup buffer.
	{
		vector<deUint8> bufData(blockInfo.dataSize);
		std::fill(bufData.begin(), bufData.end(), 0);

		getInputs((int)numValues, (int)inVarInfo.arrayStride, &bufData[0] + inVarInfo.offset);

		if (m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE)
		{
			for (deUint32 valNdx = 0; valNdx < product(m_numWorkGroups); valNdx++)
				*(deUint32*)(&bufData[0] + groupVarInfo.offset + groupVarInfo.arrayStride*valNdx) = m_initialValue;
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		bool			isOk		= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		isOk = verify((int)numValues,
					  (int)inVarInfo.arrayStride, (const deUint8*)resPtr + inVarInfo.offset,
					  (int)outVarInfo.arrayStride, (const deUint8*)resPtr + outVarInfo.offset,
					  (int)groupVarInfo.arrayStride, (const deUint8*)resPtr + groupVarInfo.offset);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}